

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  uint uVar6;
  string *psVar7;
  ulong uVar8;
  cmState *pcVar9;
  size_type sVar10;
  reference __args;
  reference __args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  string_view sVar12;
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar13;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  size_type local_920;
  size_t ii;
  cmAlphaNum local_8e8;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  string_view local_870;
  undefined1 local_860 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filterList;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_840;
  const_iterator local_838;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_830;
  const_iterator local_828;
  allocator<char> local_819;
  string local_818;
  string_view local_7f8;
  allocator<char> local_7e1;
  string local_7e0;
  string_view local_7c0;
  cmAlphaNum local_7b0;
  cmAlphaNum local_780;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  string *local_6e0;
  _Base_ptr local_6d8;
  undefined1 local_6d0;
  _Base_ptr local_6c8;
  undefined1 local_6c0;
  cmTarget *local_6b8;
  cmTarget *depTarget;
  string *depName;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_688;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_670;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_660;
  string *local_640;
  string *deps;
  string local_630;
  string_view local_610;
  cmAlphaNum local_600;
  cmAlphaNum local_5d0;
  string local_5a0;
  string_view local_580;
  string_view local_570;
  cmAlphaNum local_560;
  cmAlphaNum local_530;
  string local_500;
  string_view local_4e0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  string local_470;
  allocator<char> local_449;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  string *prop;
  cmAlphaNum local_3f0;
  string local_3c0;
  int local_39c;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  cmAlphaNum local_388;
  cmAlphaNum local_358;
  string local_328;
  string_view local_308;
  string local_2f8;
  cmAlphaNum local_2d8;
  cmAlphaNum local_2a8;
  string local_278;
  allocator<char> local_251;
  string local_250;
  cmAlphaNum local_230;
  cmAlphaNum local_200;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  string cbd;
  string relativeBuildDir;
  string local_148;
  string *local_128;
  allocator<char> local_119;
  string local_118;
  string *local_f8;
  allocator<char> local_e9;
  string local_e8;
  cmValue local_c8;
  cmValue folder;
  unsigned_long local_b0;
  unsigned_long iVerb;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string def;
  string local_38;
  cmQtAutoGenInitializer *local_18;
  cmQtAutoGenInitializer *this_local;
  
  local_18 = this;
  iVar4 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x26])();
  this->MultiConfig = SUB41(iVar4,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_38,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&def.field_2._M_allocated_capacity + 1);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(pvVar11,this->Makefile,IncludeEmptyConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ConfigsList,pvVar11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar11);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_AUTOGEN_VERBOSE",&local_91);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_90);
  std::__cxx11::string::string((string *)local_70,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    local_b0 = 0;
    bVar3 = cmStrToULong((string *)local_70,&local_b0);
    if (bVar3) {
      this->Verbosity = (uint)local_b0;
    }
    else {
      sVar12 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
      folder.Value = (string *)sVar12._M_len;
      bVar3 = cmIsOn(sVar12);
      if (bVar3) {
        this->Verbosity = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  pcVar9 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"AUTOMOC_TARGETS_FOLDER",&local_e9);
  local_c8 = cmState::GetGlobalProperty(pcVar9,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (!bVar3) {
    pcVar9 = cmMakefile::GetState(this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"AUTOGEN_TARGETS_FOLDER",&local_119);
    local_f8 = (string *)cmState::GetGlobalProperty(pcVar9,&local_118);
    local_c8 = (cmValue)local_f8;
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (!bVar3) {
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"FOLDER",
               (allocator<char> *)(relativeBuildDir.field_2._M_local_buf + 0xf));
    local_128 = (string *)cmGeneratorTarget::GetProperty(pcVar2,&local_148);
    local_c8 = (cmValue)local_128;
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)(relativeBuildDir.field_2._M_local_buf + 0xf));
  }
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (bVar3) {
    psVar7 = cmValue::operator*[abi_cxx11_(&local_c8);
    std::__cxx11::string::operator=((string *)&this->TargetsFolder,(string *)psVar7);
  }
  PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar5 != OLD) {
    if (PVar5 == WARN) {
      this->CMP0071Warn = true;
    }
    else if (PVar5 - NEW < 3) {
      this->CMP0071Accept = true;
    }
  }
  PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar5 != OLD) {
    if (PVar5 == WARN) {
      this->CMP0100Warn = true;
    }
    else if (PVar5 - NEW < 3) {
      this->CMP0100Accept = true;
    }
  }
  std::__cxx11::string::string((string *)(cbd.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1b0);
  psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)local_190,&local_1b0,psVar7);
  std::__cxx11::string::~string((string *)&local_1b0);
  cmAlphaNum::cmAlphaNum(&local_200,(string *)local_190);
  cmAlphaNum::cmAlphaNum(&local_230,"/CMakeFiles/");
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<std::__cxx11::string,char[13]>
            (&local_1d0,&local_200,&local_230,psVar7,(char (*) [13])"_autogen.dir");
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar2 = this->GenTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AUTOGEN_BUILD_DIR",&local_251);
  psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_250);
  std::__cxx11::string::operator=((string *)&(this->Dir).Build,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_2a8,(string *)local_190);
    cmAlphaNum::cmAlphaNum(&local_2d8,'/');
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmStrCat<std::__cxx11::string,char[9]>
              (&local_278,&local_2a8,&local_2d8,psVar7,(char (*) [9])0xd33260);
    std::__cxx11::string::operator=((string *)&(this->Dir).Build,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Build);
  cmSystemTools::RelativePath(&local_2f8,(string *)local_190,&(this->Dir).Build);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  AddCleanFile(this,&(this->Dir).Build);
  std::__cxx11::string::operator=((string *)&(this->Dir).Work,(string *)local_190);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Work);
  cmAlphaNum::cmAlphaNum(&local_358,&(this->Dir).Build);
  cmAlphaNum::cmAlphaNum(&local_388,"/include");
  cmStrCat<>(&local_328,&local_358,&local_388);
  local_308 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_328);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"");
  sVar12._M_str = local_398._M_str;
  sVar12._M_len = local_398._M_len;
  ConfigFileNamesAndGenex(this,&(this->Dir).Include,&(this->Dir).IncludeGenExp,local_308,sVar12);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)local_190);
  bVar3 = MocOrUicEnabled(this);
  if (bVar3) {
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitMoc(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_39c = 1;
        goto LAB_0045dad8;
      }
    }
    if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitUic(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_39c = 1;
        goto LAB_0045dad8;
      }
    }
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmAlphaNum::cmAlphaNum(&local_3f0,psVar7);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&prop,"_autogen");
    cmStrCat<>(&local_3c0,&local_3f0,(cmAlphaNum *)&prop);
    std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"AUTOGEN_PARALLEL",&local_449);
    psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    local_428 = psVar7;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      bVar3 = std::operator==(local_428,"AUTO");
      if (bVar3) goto LAB_0045cad9;
      (this->AutogenTarget).Parallel = 1;
    }
    else {
LAB_0045cad9:
      uVar6 = anon_unknown.dwarf_71de24::GetParallelCPUCount();
      (this->AutogenTarget).Parallel = uVar6;
    }
    cmAlphaNum::cmAlphaNum(&local_4a0,&(this->Dir).Info);
    cmAlphaNum::cmAlphaNum(&local_4d0,"/AutogenInfo.json");
    cmStrCat<>(&local_470,&local_4a0,&local_4d0);
    std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    cmAlphaNum::cmAlphaNum(&local_530,&(this->Dir).Info);
    cmAlphaNum::cmAlphaNum(&local_560,"/AutogenUsed");
    cmStrCat<>(&local_500,&local_530,&local_560);
    local_4e0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_500);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_570,".txt");
    ConfigFileNames(this,&(this->AutogenTarget).SettingsFile,local_4e0,local_570);
    std::__cxx11::string::~string((string *)&local_500);
    ConfigFileClean(this,&(this->AutogenTarget).SettingsFile);
    cmAlphaNum::cmAlphaNum(&local_5d0,&(this->Dir).Info);
    cmAlphaNum::cmAlphaNum(&local_600,"/ParseCache");
    cmStrCat<>(&local_5a0,&local_5d0,&local_600);
    local_580 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_610,".txt");
    ConfigFileNames(this,&(this->AutogenTarget).ParseCacheFile,local_580,local_610);
    std::__cxx11::string::~string((string *)&local_5a0);
    ConfigFileClean(this,&(this->AutogenTarget).ParseCacheFile);
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)((long)&deps + 7));
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_630);
    (this->AutogenTarget).DependOrigin = bVar3;
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)((long)&deps + 7));
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,"AUTOGEN_TARGET_DEPENDS",
               (allocator<char> *)((long)&__range3 + 7));
    psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    local_640 = psVar7;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      sVar12 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_640);
      cmExpandedList_abi_cxx11_(&local_688,sVar12,false);
      local_670 = &local_688;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_670);
      depName = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(local_670);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&depName);
        if (!bVar3) break;
        depTarget = (cmTarget *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_6b8 = cmMakefile::FindTargetToUse(this->Makefile,(string *)depTarget,false);
        if (local_6b8 == (cmTarget *)0x0) {
          pVar14 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&(this->AutogenTarget).DependFiles,(value_type *)depTarget);
          local_6d8 = (_Base_ptr)pVar14.first._M_node;
          local_6d0 = pVar14.second;
        }
        else {
          pVar13 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                             (&(this->AutogenTarget).DependTargets,&local_6b8);
          local_6c8 = (_Base_ptr)pVar13.first._M_node;
          local_6c0 = pVar13.second;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      local_39c = 4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_688);
    }
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"AUTOMOC_PATH_PREFIX",&local_701);
      local_6e0 = (string *)cmGeneratorTarget::GetProperty(pcVar2,&local_700);
      bVar3 = cmIsOn((cmValue)local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      if (bVar3) {
        (this->Moc).PathPrefix = true;
      }
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,"CMAKE_AUTOMOC_RELAXED_MODE",&local_729);
      bVar3 = cmMakefile::IsOn(pcVar1,&local_728);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      if (bVar3) {
        (this->Moc).RelaxedMode = true;
        pcVar1 = this->Makefile;
        cmAlphaNum::cmAlphaNum
                  (&local_780,
                   "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  Consider disabling it and converting the target "
                  );
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        cmAlphaNum::cmAlphaNum(&local_7b0,psVar7);
        cmStrCat<char[18]>(&local_750,&local_780,&local_7b0,(char (*) [18])" to regular mode.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
      }
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e0,"AUTOMOC_MOC_OPTIONS",&local_7e1);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_7e0);
      local_7c0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmExpandList(local_7c0,&(this->Moc).Options,false);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator(&local_7e1);
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"AUTOMOC_MACRO_NAMES",&local_819);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_818);
      local_7f8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmExpandList(local_7f8,&(this->Moc).MacroNames,false);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      pvVar11 = &(this->Moc).MacroNames;
      local_830._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (pvVar11);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_828,&local_830);
      local_840._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(this->Moc).MacroNames);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_838,&local_840);
      filterList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::erase(pvVar11,local_828,local_838);
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,"AUTOMOC_DEPEND_FILTERS",&local_891);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_890);
      local_870 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_860,local_870,false);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_860);
      if ((sVar10 & 1) == 0) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_860);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&(this->Moc).DependFilters,(sVar10 >> 1) + 1);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[18],char_const(&)[57]>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&(this->Moc).DependFilters,(char (*) [18])"Q_PLUGIN_METADATA",
                   (char (*) [57])
                   "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
        local_920 = 0;
        while( true ) {
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_860);
          if (local_920 == sVar10) break;
          __args = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_860,local_920);
          __args_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_860,local_920 + 1);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string&,std::__cxx11::string&>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&(this->Moc).DependFilters,__args,__args_1);
          local_920 = local_920 + 2;
        }
        local_39c = 0;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_8e8,"AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ");
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_860);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ii,sVar10);
        cmStrCat<char[25]>(&local_8b8,&local_8e8,(cmAlphaNum *)&ii,
                           (char (*) [25])" is not a multiple of 2.");
        cmSystemTools::Error(&local_8b8);
        std::__cxx11::string::~string((string *)&local_8b8);
        this_local._7_1_ = 0;
        local_39c = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_860);
      if (local_39c != 0) goto LAB_0045dad8;
    }
  }
  if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
    bVar3 = InitRcc(this);
    if (!bVar3) {
      this_local._7_1_ = 0;
      local_39c = 1;
      goto LAB_0045dad8;
    }
  }
  bVar3 = MocOrUicEnabled(this);
  if ((bVar3) ||
     ((((this->Rcc).super_GenVarsT.Enabled & 1U) != 0 && ((this->MultiConfig & 1U) != 0)))) {
    cmGeneratorTarget::AddIncludeDirectory(this->GenTarget,&(this->Dir).IncludeGenExp,true);
  }
  bVar3 = InitScanFiles(this);
  if (bVar3) {
    bVar3 = MocOrUicEnabled(this);
    if (bVar3) {
      bVar3 = InitAutogenTarget(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_39c = 1;
        goto LAB_0045dad8;
      }
    }
    if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitRccTargets(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_39c = 1;
        goto LAB_0045dad8;
      }
    }
    this_local._7_1_ = 1;
    local_39c = 1;
  }
  else {
    this_local._7_1_ = 0;
    local_39c = 1;
  }
LAB_0045dad8:
  std::__cxx11::string::~string((string *)(cbd.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else {
        this->AutogenTarget.Parallel = 1;
      }
    }

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (std::string const& depName : cmExpandedList(deps)) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (cmIsOn(this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX"))) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        auto filterList = cmExpandedList(
          this->GenTarget->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (std::size_t ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}